

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
           *this,GraphicsPipelineStateCreateInfo *CI)

{
  PipelineResourceLayoutDescX *this_00;
  IPipelineStateCache *pPipelineStateCache;
  GraphicsPipelineStateCreateInfo *pGVar1;
  Uint32 UVar2;
  undefined4 uVar3;
  SHADER_RESOURCE_VARIABLE_TYPE SVar4;
  undefined3 uVar5;
  SHADER_TYPE SVar6;
  Uint32 UVar7;
  undefined4 uVar8;
  ulong uVar9;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  Char *local_28;
  
  memcpy(this,CI,0x158);
  this_00 = &this->ResourceLayout;
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (this_00,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  (this->StringPool)._M_h._M_buckets = &(this->StringPool)._M_h._M_single_bucket;
  (this->StringPool)._M_h._M_bucket_count = 1;
  (this->StringPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->StringPool)._M_h._M_element_count = 0;
  (this->StringPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->StringPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->StringPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  local_28 = (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
             super_DeviceObjectAttribs.Name;
  if (local_28 != (Char *)0x0) {
    pVar10 = std::
             _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::_M_emplace<char_const*&>
                       ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&this->StringPool,&local_28);
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name =
         *(Char **)((long)pVar10.first.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   + 8);
  }
  if ((CI->super_PipelineStateCreateInfo).ResourceSignaturesCount != 0) {
    uVar9 = 0;
    do {
      AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount);
  }
  pPipelineStateCache = (CI->super_PipelineStateCreateInfo).pPSOCache;
  if (pPipelineStateCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,pPipelineStateCache);
  }
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout
  .ImmutableSamplers = (this->ResourceLayout).super_PipelineResourceLayoutDesc.ImmutableSamplers;
  SVar4 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableType;
  uVar5 = *(undefined3 *)&(this_00->super_PipelineResourceLayoutDesc).field_0x1;
  SVar6 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages;
  UVar7 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumVariables;
  uVar8 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0xc;
  UVar2 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumImmutableSamplers;
  uVar3 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0x1c;
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout
  .Variables = (this->ResourceLayout).super_PipelineResourceLayoutDesc.Variables;
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout
  .NumImmutableSamplers = UVar2;
  *(undefined4 *)
   &(this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0x1c = uVar3;
  pGVar1 = &this->super_GraphicsPipelineStateCreateInfo;
  (pGVar1->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType = SVar4;
  *(undefined3 *)&(pGVar1->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1 = uVar5;
  (pGVar1->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages = SVar6;
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout
  .NumVariables = UVar7;
  *(undefined4 *)
   &(this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0xc = uVar8;
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData =
       (this->InternalData)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }